

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimer.cpp
# Opt level: O3

void __thiscall QTimer::QTimer(QTimer *this,QObject *parent)

{
  QObjectPrivate *this_00;
  
  (this->super_QObject)._vptr_QObject = (_func_int **)&PTR_metaObject_0069b900;
  this_00 = (QObjectPrivate *)operator_new(0xa8);
  QObjectPrivate::QObjectPrivate(this_00,QObjectPrivateVersion);
  (this_00->super_QObjectData)._vptr_QObjectData = (_func_int **)&PTR__QTimerPrivate_0069ba00;
  this_00[1].super_QObjectData._vptr_QObjectData = (_func_int **)0x0;
  this_00[1].super_QObjectData.q_ptr = (QObject *)0x0;
  *(undefined1 *)&this_00[1].super_QObjectData.parent = 0;
  *(undefined4 *)((long)&this_00[1].super_QObjectData.parent + 4) = 1;
  this_00[1].super_QObjectData.children.d.ptr = (QObject **)this;
  *(undefined1 *)&this_00[1].super_QObjectData.children.d.size = 1;
  QObject::QObject(&this->super_QObject,this_00,parent);
  (this->super_QObject)._vptr_QObject = (_func_int **)&PTR_metaObject_0069b900;
  return;
}

Assistant:

QTimer::QTimer(QObject *parent)
    : QObject(*new QTimerPrivate(this), parent)
{
    Q_ASSERT(d_func()->isQTimer);
}